

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

string * __thiscall
Omega_h::ExprEnv::string_abi_cxx11_(string *__return_storage_ptr__,ExprEnv *this,int verbose)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  any *extraout_RDX;
  any *extraout_RDX_00;
  any *operand;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
  i;
  string sep;
  string str;
  ostringstream vs;
  ostringstream oss;
  storage_union local_3b0;
  vtable_type *local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
  local_398;
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  ostringstream local_320 [376];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::string::string(local_360,"",(allocator *)&local_398);
  for (p_Var2 = (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->variables)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
    ::pair(&local_398,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
            *)(p_Var2 + 1));
    local_3a0 = local_398.second.vtable;
    operand = extraout_RDX;
    if (local_398.second.vtable != (vtable_type *)0x0) {
      (*(local_398.second.vtable)->copy)(&local_398.second.storage,&local_3b0);
      operand = extraout_RDX_00;
    }
    any_cast<std::__cxx11::string>(&local_340,(Omega_h *)&local_3b0,operand);
    poVar1 = std::operator<<((ostream *)local_320,local_360);
    poVar1 = std::operator<<(poVar1,"{");
    poVar1 = std::operator<<(poVar1,(string *)&local_398);
    poVar1 = std::operator<<(poVar1," : ");
    poVar1 = std::operator<<(poVar1,(string *)&local_340);
    std::operator<<(poVar1,"}");
    std::__cxx11::string::assign((char *)local_360);
    std::__cxx11::string::~string((string *)&local_340);
    if (local_3a0 != (vtable_type *)0x0) {
      (*local_3a0->destroy)(&local_3b0);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
    ::~pair(&local_398);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"ExprEnv:");
  poVar1 = std::operator<<(poVar1,"\n  size      = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->size);
  poVar1 = std::operator<<(poVar1,"\n  dim       = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->dim);
  poVar1 = std::operator<<(poVar1,"\n  variables = ");
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar1,(string *)&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_360);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ExprEnv::string(int verbose) {
  //std::map<std::string, any> variables;
  //std::map<std::string, Function> functions;
  //LO size;
  //Int dim;
  std::ostringstream oss, vs;
  std::string sep = "";
  for(auto i : variables) {
    auto v = i.second;
    std::string str = any_cast<std::string>(v);
    vs << sep << "{" << i.first << " : " << str << "}";
    sep = " ";
  }
  oss << "ExprEnv:"
      << "\n  size      = " << size
      << "\n  dim       = " << dim
      << "\n  variables = " << vs.str();
  (void)verbose;
  return oss.str();
}